

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daxpy.c
# Opt level: O3

int daxpy_(int *n,double *sa,double *sx,int *incx,double *sy,int *incy)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  double *pdVar8;
  
  lVar4 = (long)*n;
  if (0 < lVar4) {
    dVar1 = *sa;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      iVar2 = *incx;
      iVar3 = *incy;
      if (iVar3 == 1 && iVar2 == 1) {
        if ((uint)*n < 4) {
          lVar5 = 0;
        }
        else {
          lVar5 = 0;
          do {
            sy[lVar5] = sx[lVar5] * dVar1 + sy[lVar5];
            sy[lVar5 + 1] = sx[lVar5 + 1] * dVar1 + sy[lVar5 + 1];
            sy[lVar5 + 2] = sx[lVar5 + 2] * dVar1 + sy[lVar5 + 2];
            sy[lVar5 + 3] = sx[lVar5 + 3] * dVar1 + sy[lVar5 + 3];
            lVar5 = lVar5 + 4;
          } while (lVar5 < lVar4 + -3);
        }
        if (lVar5 < lVar4) {
          do {
            sy[lVar5] = sx[lVar5] * dVar1 + sy[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar4 != lVar5);
        }
      }
      else {
        lVar5 = (1 - lVar4) * (long)iVar3;
        if (-1 < iVar3) {
          lVar5 = 0;
        }
        lVar7 = (1 - lVar4) * (long)iVar2;
        if (-1 < iVar2) {
          lVar7 = 0;
        }
        pdVar6 = sx + lVar7;
        pdVar8 = sy + lVar5;
        do {
          *pdVar8 = *pdVar6 * dVar1 + *pdVar8;
          pdVar6 = pdVar6 + iVar2;
          pdVar8 = pdVar8 + iVar3;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
    }
  }
  return 0;
}

Assistant:

int daxpy_(int *n, double *sa, double *sx, int *incx, double *sy,
           int *incy)
{
  long int i, m, ix, iy, nn, iincx, iincy;
  register double ssa;

  /* constant times a vector plus a vector.   
     uses unrolled loop for increments equal to one.   
     jack dongarra, linpack, 3/11/78.   
     modified 12/3/93, array(1) declarations changed to array(*) */

  /* Dereference inputs */
  nn = *n;
  ssa = *sa;
  iincx = *incx;
  iincy = *incy;

  if( nn > 0 && ssa != 0.0 )
  {
    if (iincx == 1 && iincy == 1) /* code for both increments equal to 1 */
    {
      m = nn-3;
      for (i = 0; i < m; i += 4)
      {
        sy[i] += ssa * sx[i];
        sy[i+1] += ssa * sx[i+1];
        sy[i+2] += ssa * sx[i+2];
        sy[i+3] += ssa * sx[i+3];
      }
      for ( ; i < nn; ++i) /* clean-up loop */
        sy[i] += ssa * sx[i];
    }
    else /* code for unequal increments or equal increments not equal to 1 */
    {
      ix = iincx >= 0 ? 0 : (1 - nn) * iincx;
      iy = iincy >= 0 ? 0 : (1 - nn) * iincy;
      for (i = 0; i < nn; i++)
      {
        sy[iy] += ssa * sx[ix];
        ix += iincx;
        iy += iincy;
      }
    }
  }

  return 0;
}